

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsyntaxhighlighter.cpp
# Opt level: O0

void __thiscall QSyntaxHighlighter::setDocument(QSyntaxHighlighter *this,QTextDocument *doc)

{
  bool bVar1;
  QSyntaxHighlighterPrivate *this_00;
  QTextDocument *pQVar2;
  QTextDocument *pQVar3;
  QTextBlock *in_RSI;
  QTextDocument *in_RDI;
  long in_FS_OFFSET;
  QSyntaxHighlighterPrivate *d;
  QTextCursor cursor;
  QTextBlock blk;
  undefined4 in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffcc;
  QTextBlock local_28;
  undefined1 local_18 [16];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar3 = in_RDI;
  this_00 = d_func((QSyntaxHighlighter *)0x79ac8e);
  bVar1 = ::QPointer::operator_cast_to_bool((QPointer<QTextDocument> *)0x79aca1);
  if (bVar1) {
    pQVar2 = ::QPointer::operator_cast_to_QTextDocument_((QPointer<QTextDocument> *)0x79acb8);
    QObject::disconnect((QObject *)pQVar2,"2contentsChange(int,int,int)",(QObject *)in_RDI,
                        "1_q_reformatBlocks(int,int,int)");
    ::QPointer::operator_cast_to_QTextDocument_((QPointer<QTextDocument> *)0x79acec);
    QTextCursor::QTextCursor((QTextCursor *)pQVar3,(QTextDocument *)in_RSI);
    QTextCursor::beginEditBlock((QTextCursor *)this_00);
    local_18._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_18._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    QPointer<QTextDocument>::operator->((QPointer<QTextDocument> *)0x79ad29);
    QTextDocument::begin(pQVar3);
    while (bVar1 = QTextBlock::isValid((QTextBlock *)this_00), bVar1) {
      QTextBlock::layout(in_RSI);
      QTextLayout::clearFormats((QTextLayout *)in_RSI);
      QTextBlock::next((QTextBlock *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
      QTextBlock::operator=((QTextBlock *)local_18,&local_28);
    }
    QTextCursor::endEditBlock((QTextCursor *)this_00);
    QTextCursor::~QTextCursor((QTextCursor *)0x79ad8c);
  }
  QPointer<QTextDocument>::operator=((QPointer<QTextDocument> *)this_00,in_RDI);
  bVar1 = ::QPointer::operator_cast_to_bool((QPointer<QTextDocument> *)0x79adad);
  if (bVar1) {
    pQVar3 = ::QPointer::operator_cast_to_QTextDocument_((QPointer<QTextDocument> *)0x79adc1);
    QObject::connect((QObject *)&stack0xffffffffffffffc8,(char *)pQVar3,
                     (QObject *)"2contentsChange(int,int,int)",(char *)in_RDI,0xbcfbc0);
    QMetaObject::Connection::~Connection((Connection *)&stack0xffffffffffffffc8);
    QPointer<QTextDocument>::operator->((QPointer<QTextDocument> *)0x79adfb);
    bVar1 = QTextDocument::isEmpty((QTextDocument *)this_00);
    if (!bVar1) {
      this_00->rehighlightPending = true;
      QTimer::singleShot(in_stack_ffffffffffffffcc,(QObject *)this_00,(char *)in_RDI);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QSyntaxHighlighter::setDocument(QTextDocument *doc)
{
    Q_D(QSyntaxHighlighter);
    if (d->doc) {
        disconnect(d->doc, SIGNAL(contentsChange(int,int,int)),
                   this, SLOT(_q_reformatBlocks(int,int,int)));

        QTextCursor cursor(d->doc);
        cursor.beginEditBlock();
        for (QTextBlock blk = d->doc->begin(); blk.isValid(); blk = blk.next())
            blk.layout()->clearFormats();
        cursor.endEditBlock();
    }
    d->doc = doc;
    if (d->doc) {
        connect(d->doc, SIGNAL(contentsChange(int,int,int)),
                this, SLOT(_q_reformatBlocks(int,int,int)));
        if (!d->doc->isEmpty()) {
            d->rehighlightPending = true;
            QTimer::singleShot(0, this, SLOT(_q_delayedRehighlight()));
        }
    }
}